

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O0

void ultag_close(ULanguageTag *langtag)

{
  VariantListEntry *pVVar1;
  ExtensionListEntry *pEVar2;
  ExtensionListEntry *nextExt;
  ExtensionListEntry *curExt;
  VariantListEntry *nextVar;
  VariantListEntry *curVar;
  ULanguageTag *langtag_local;
  
  if (langtag != (ULanguageTag *)0x0) {
    uprv_free_63(langtag->buf);
    if (langtag->variants != (VariantListEntry *)0x0) {
      nextVar = langtag->variants;
      while (nextVar != (VariantListEntry *)0x0) {
        pVVar1 = nextVar->next;
        uprv_free_63(nextVar);
        nextVar = pVVar1;
      }
    }
    if (langtag->extensions != (ExtensionListEntry *)0x0) {
      nextExt = langtag->extensions;
      while (nextExt != (ExtensionListEntry *)0x0) {
        pEVar2 = nextExt->next;
        uprv_free_63(nextExt);
        nextExt = pEVar2;
      }
    }
    uprv_free_63(langtag);
  }
  return;
}

Assistant:

static void
ultag_close(ULanguageTag* langtag) {

    if (langtag == NULL) {
        return;
    }

    uprv_free(langtag->buf);

    if (langtag->variants) {
        VariantListEntry *curVar = langtag->variants;
        while (curVar) {
            VariantListEntry *nextVar = curVar->next;
            uprv_free(curVar);
            curVar = nextVar;
        }
    }

    if (langtag->extensions) {
        ExtensionListEntry *curExt = langtag->extensions;
        while (curExt) {
            ExtensionListEntry *nextExt = curExt->next;
            uprv_free(curExt);
            curExt = nextExt;
        }
    }

    uprv_free(langtag);
}